

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void do_rename(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  char *pcVar3;
  FILE *pFVar4;
  CHAR_DATA *pCVar5;
  char *pcVar6;
  CHAR_DATA *in_RDI;
  int cres;
  CHAR_DATA *victim;
  char *cname;
  char pbuf [4608];
  char strsave [4608];
  char new_name [4608];
  char old_name [4608];
  CHAR_DATA *in_stack_ffffffffffffb7c8;
  char *__s;
  uint in_stack_ffffffffffffb7d0;
  undefined4 uVar7;
  CHAR_DATA *in_stack_ffffffffffffb7d8;
  char *in_stack_ffffffffffffb7e0;
  char *in_stack_ffffffffffffb7f8;
  char local_3618 [4584];
  char *in_stack_ffffffffffffdbd0;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  char local_2418 [4608];
  char local_1218;
  undefined1 in_stack_ffffffffffffedef;
  char *in_stack_ffffffffffffedf0;
  
  uVar7 = 0;
  one_argument((char *)(ulong)in_stack_ffffffffffffb7d0,(char *)in_stack_ffffffffffffb7c8);
  one_argument((char *)CONCAT44(uVar7,in_stack_ffffffffffffb7d0),(char *)in_stack_ffffffffffffb7c8);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
  }
  else if (local_2418[0] == '\0') {
    send_to_char(in_stack_ffffffffffffb7e0,in_stack_ffffffffffffb7d8);
  }
  else {
    ch_00 = get_char_world(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffb7e0,(CHAR_DATA *)0x0);
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffb7c8);
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffb7e0,ch_00);
      }
      else {
        if (ch_00 != in_RDI) {
          in_stack_ffffffffffffb7d0 = get_trust(in_stack_ffffffffffffb7c8);
          iVar2 = get_trust(in_stack_ffffffffffffb7c8);
          if (iVar2 <= (int)in_stack_ffffffffffffb7d0) {
            send_to_char(in_stack_ffffffffffffb7e0,ch_00);
            return;
          }
        }
        if ((ch_00->desc == (DESCRIPTOR_DATA *)0x0) || (ch_00->desc->connected != 0)) {
          send_to_char(in_stack_ffffffffffffb7e0,ch_00);
        }
        else {
          bVar1 = check_parse_name(in_stack_ffffffffffffb7f8);
          if (bVar1) {
            bVar1 = is_affected(ch_00,(int)gsn_cloak_form);
            if ((!bVar1) && (bVar1 = is_shifted(ch_00), !bVar1)) {
              __s = local_3618;
              pcVar3 = capitalize(local_2418);
              sprintf(__s,"%s/%s.plr","../player",pcVar3);
              pFVar4 = fopen(local_3618,"r");
              if (pFVar4 != (FILE *)0x0) {
                send_to_char(in_stack_ffffffffffffb7e0,ch_00);
                return;
              }
              pCVar5 = get_char_world(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
              if (pCVar5 != (CHAR_DATA *)0x0) {
                send_to_char(in_stack_ffffffffffffb7e0,ch_00);
                return;
              }
              pcVar3 = capitalize(local_2418);
              iVar2 = CSQLInterface::Update
                                (&RS.SQL,"players SET name = \'%s\' WHERE name = \'%s\' LIMIT 1",
                                 pcVar3,ch_00->true_name);
              pcVar3 = palloc_string(in_stack_ffffffffffffb7f8);
              free_pstring((char *)CONCAT44(iVar2,in_stack_ffffffffffffb7d0));
              free_pstring((char *)CONCAT44(iVar2,in_stack_ffffffffffffb7d0));
              free_pstring((char *)CONCAT44(iVar2,in_stack_ffffffffffffb7d0));
              capitalize(local_2418);
              pcVar6 = palloc_string(in_stack_ffffffffffffb7f8);
              ch_00->name = pcVar6;
              capitalize(local_2418);
              pcVar6 = palloc_string(in_stack_ffffffffffffb7f8);
              ch_00->true_name = pcVar6;
              capitalize(local_2418);
              pcVar6 = palloc_string(in_stack_ffffffffffffb7f8);
              ch_00->backup_true_name = pcVar6;
              save_char_obj((CHAR_DATA *)pbuf._56_8_);
              delete_char(in_stack_ffffffffffffedf0,(bool)in_stack_ffffffffffffedef);
              send_to_char(pcVar3,ch_00);
              act(pcVar3,ch_00,(void *)CONCAT44(iVar2,in_stack_ffffffffffffb7d0),__s,0);
              return;
            }
            send_to_char(in_stack_ffffffffffffb7e0,ch_00);
          }
          else {
            send_to_char(in_stack_ffffffffffffb7e0,ch_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_rename(CHAR_DATA *ch, char *argument)
{
	char old_name[MAX_INPUT_LENGTH], new_name[MAX_INPUT_LENGTH], strsave[MAX_INPUT_LENGTH], pbuf[MSL], *cname;
	CHAR_DATA *victim;
	int cres = 0;

	argument = one_argument(argument, old_name);
	one_argument(argument, new_name);

	if (old_name[0] == '\0')
	{
		send_to_char("Rename who?\n\r", ch);
		return;
	}

	if (new_name[0] == '\0')
	{
		send_to_char("Rename to what new name?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, old_name);

	if (!victim)
	{
		send_to_char("There is no such a person online.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Use string.\n\r", ch);
		return;
	}

	if ((victim != ch) && (get_trust(victim) >= get_trust(ch)))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (!victim->desc || (victim->desc->connected != CON_PLAYING))
	{
		send_to_char("They are link-dead.\n\r", ch);
		return;
	}

	if (!check_parse_name(new_name))
	{
		send_to_char("That new name is illegal.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_cloak_form) || is_shifted(victim))
	{
		send_to_char("They must be in normal form.\n\r", ch);
		return;
	}

	sprintf(strsave, "%s/%s.plr", RIFT_PLAYER_DIR, capitalize(new_name));

	if (fopen(strsave, "r") != nullptr)
	{
		send_to_char("A player with that name already exists.\n\r", ch);
		return;
	}

	if (get_char_world(ch, new_name))
	{
		send_to_char("A player with the name you specified already exists.\n\r", ch);
		return;
	}

	cres = RS.SQL.Update("players SET name = '%s' WHERE name = '%s' LIMIT 1", capitalize(new_name), victim->true_name);
	cname = palloc_string(victim->true_name);

	free_pstring(victim->name);
	free_pstring(victim->true_name);
	free_pstring(victim->backup_true_name);
	victim->name = palloc_string(capitalize(new_name));
	victim->true_name = palloc_string(capitalize(new_name));
	victim->backup_true_name = palloc_string(capitalize(new_name));

	save_char_obj(victim);

	delete_char(cname, false);

	//	unlink(strsave);

	send_to_char("Character renamed.\n\r", ch);
	act("$n has renamed you to $N!", ch, nullptr, victim, TO_VICT);
}